

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

void upb_Message_Freeze(upb_Message *msg,upb_MiniTable *m)

{
  upb_MiniTableField *f;
  byte bVar1;
  upb_MiniTableField *puVar2;
  upb_MiniTableExtension *f_00;
  upb_Array *arr;
  size_t map;
  _Bool _Var3;
  upb_CType uVar4;
  upb_MiniTable *puVar5;
  upb_Extension *puVar6;
  upb_Message **ppuVar7;
  size_t *psVar8;
  upb_MessageValue *puVar9;
  long lVar10;
  ulong uVar11;
  size_t ext_count;
  upb_Message *local_40;
  long local_38;
  
  if (((msg->field_0).internal_opaque & 1) == 0) {
    (msg->field_0).internal_opaque = (msg->field_0).internal_opaque | 1;
    local_38 = (ulong)m->field_count_dont_copy_me__upb_internal_use_only * 0xc;
    for (lVar10 = 0; local_38 != lVar10; lVar10 = lVar10 + 0xc) {
      puVar2 = m->fields_dont_copy_me__upb_internal_use_only;
      f = (upb_MiniTableField *)((long)&puVar2->number_dont_copy_me__upb_internal_use_only + lVar10)
      ;
      puVar5 = upb_MiniTable_SubMessage(m,f);
      switch((&puVar2->mode_dont_copy_me__upb_internal_use_only)[lVar10] & 3) {
      case 0:
        _upb_MiniTableField_CheckIsMap_dont_copy_me__upb_internal_use_only(f);
        _upb_MiniTableField_CheckIsMap_dont_copy_me__upb_internal_use_only(f);
        ext_count = 0;
        if ((f->mode_dont_copy_me__upb_internal_use_only & 8) != 0) {
LAB_0011763c:
          __assert_fail("!upb_MiniTableField_IsExtension(field)",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/message/internal/accessors.h"
                        ,0x10d,
                        "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                       );
        }
        if (((-1 < *(short *)((long)&puVar2->presence + lVar10)) &&
            (_Var3 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                               (f,&ext_count), _Var3)) ||
           (_Var3 = upb_Message_HasBaseField(msg,f), psVar8 = &ext_count, _Var3)) {
          psVar8 = (size_t *)
                   ((long)&msg->field_0 +
                   (ulong)*(ushort *)
                           ((long)&puVar2->offset_dont_copy_me__upb_internal_use_only + lVar10));
        }
        _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,&local_40,psVar8);
        if (((ulong)local_40 & 1) != 0) {
          __assert_fail("!upb_TaggedMessagePtr_IsEmpty(tagged)",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/message/internal/accessors.h"
                        ,0x1ac,
                        "void _upb_Message_AssertMapIsUntagged_dont_copy_me__upb_internal_use_only(const struct upb_Message *, const upb_MiniTableField *)"
                       );
        }
        local_40 = (upb_Message *)0x0;
        if ((f->mode_dont_copy_me__upb_internal_use_only & 8) != 0) goto LAB_0011763c;
        if (((-1 < *(short *)((long)&puVar2->presence + lVar10)) &&
            (_Var3 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(f,&local_40)
            , _Var3)) || (_Var3 = upb_Message_HasBaseField(msg,f), _Var3)) {
          ppuVar7 = (upb_Message **)
                    ((long)&msg->field_0 +
                    (ulong)*(ushort *)
                            ((long)&puVar2->offset_dont_copy_me__upb_internal_use_only + lVar10));
        }
        else {
          ppuVar7 = &local_40;
        }
        _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,&ext_count,ppuVar7);
        map = ext_count;
        if (ext_count != 0) {
          if (puVar5->field_count_dont_copy_me__upb_internal_use_only != 2) {
            __assert_fail("upb_MiniTable_FieldCount(m) == 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/mini_table/internal/message.h"
                          ,0xa5,
                          "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                         );
          }
          if (puVar5->fields_dont_copy_me__upb_internal_use_only[1].
              number_dont_copy_me__upb_internal_use_only != 2) {
            __assert_fail("upb_MiniTableField_Number(f) == 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/mini_table/internal/message.h"
                          ,0xa7,
                          "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                         );
          }
          puVar5 = upb_MiniTable_SubMessage
                             (puVar5,puVar5->fields_dont_copy_me__upb_internal_use_only + 1);
          upb_Map_Freeze((upb_Map *)map,puVar5);
        }
        break;
      case 1:
        _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(f);
        _upb_MiniTableField_CheckIsArray_dont_copy_me__upb_internal_use_only(f);
        local_40 = (upb_Message *)0x0;
        if ((f->mode_dont_copy_me__upb_internal_use_only & 8) != 0) goto LAB_0011763c;
        if (((-1 < *(short *)((long)&puVar2->presence + lVar10)) &&
            (_Var3 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(f,&local_40)
            , _Var3)) || (_Var3 = upb_Message_HasBaseField(msg,f), _Var3)) {
          ppuVar7 = (upb_Message **)
                    ((long)&msg->field_0 +
                    (ulong)*(ushort *)
                            ((long)&puVar2->offset_dont_copy_me__upb_internal_use_only + lVar10));
        }
        else {
          ppuVar7 = &local_40;
        }
        _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,&ext_count,ppuVar7);
        if (ext_count != 0) {
          upb_Array_Freeze((upb_Array *)ext_count,puVar5);
        }
        break;
      case 2:
        if (puVar5 != (upb_MiniTable *)0x0) {
          ext_count = 0;
          uVar4 = upb_MiniTableField_CType(f);
          if (uVar4 != kUpb_CType_Message) {
            __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Message",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/message/internal/accessors.h"
                          ,0x1bd,
                          "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                         );
          }
          bVar1 = f->mode_dont_copy_me__upb_internal_use_only;
          if (bVar1 < 0xc0) {
            __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_8Byte"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/message/internal/accessors.h"
                          ,0x1bf,
                          "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                         );
          }
          if ((bVar1 & 3) != 2) {
            __assert_fail("upb_MiniTableField_IsScalar(f)",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/message/internal/accessors.h"
                          ,0x1c0,
                          "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                         );
          }
          if ((bVar1 & 8) != 0) goto LAB_0011763c;
          if (((-1 < *(short *)((long)&puVar2->presence + lVar10)) &&
              (_Var3 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only
                                 (f,&ext_count), _Var3)) ||
             (_Var3 = upb_Message_HasBaseField(msg,f), psVar8 = &ext_count, _Var3)) {
            psVar8 = (size_t *)
                     ((long)&msg->field_0 +
                     (ulong)*(ushort *)
                             ((long)&puVar2->offset_dont_copy_me__upb_internal_use_only + lVar10));
          }
          _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,&local_40,psVar8);
          if (((ulong)local_40 & 1) != 0) {
            __assert_fail("!upb_TaggedMessagePtr_IsEmpty(ptr)",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/message/internal/tagged_ptr.h"
                          ,0x28,
                          "struct upb_Message *upb_TaggedMessagePtr_GetNonEmptyMessage(uintptr_t)");
          }
          if (local_40 != (upb_Message *)0x0) {
            upb_Message_Freeze(local_40,puVar5);
          }
        }
      }
    }
    puVar6 = _upb_Message_Getexts_dont_copy_me__upb_internal_use_only(msg,&ext_count);
    puVar9 = &puVar6->data;
    for (uVar11 = 0; uVar11 < ext_count; uVar11 = uVar11 + 1) {
      f_00 = ((upb_Extension *)((long)puVar9 + -8))->ext;
      uVar4 = upb_MiniTableField_CType(&f_00->field_dont_copy_me__upb_internal_use_only);
      if (uVar4 == kUpb_CType_Message) {
        puVar5 = (f_00->sub_dont_copy_me__upb_internal_use_only).
                 submsg_dont_copy_me__upb_internal_use_only;
      }
      else {
        puVar5 = (upb_MiniTable *)0x0;
      }
      arr = puVar9->array_val;
      switch((f_00->field_dont_copy_me__upb_internal_use_only).
             mode_dont_copy_me__upb_internal_use_only & 3) {
      case 0:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/message/message.c"
                      ,0x93,"void upb_Message_Freeze(upb_Message *, const upb_MiniTable *)");
      case 1:
        if (arr != (upb_Array *)0x0) {
          upb_Array_Freeze(arr,puVar5);
        }
        break;
      case 2:
        if ((((f_00->field_dont_copy_me__upb_internal_use_only).
              descriptortype_dont_copy_me__upb_internal_use_only & 0xfe) == 10) &&
           (arr != (upb_Array *)0x0)) {
          upb_Message_Freeze((upb_Message *)arr,puVar5);
        }
      }
      puVar9 = (upb_MessageValue *)((long)puVar9 + 0x18);
    }
  }
  return;
}

Assistant:

void upb_Message_Freeze(upb_Message* msg, const upb_MiniTable* m) {
  if (upb_Message_IsFrozen(msg)) return;
  UPB_PRIVATE(_upb_Message_ShallowFreeze)(msg);

  // Base Fields.
  const size_t field_count = upb_MiniTable_FieldCount(m);

  for (size_t i = 0; i < field_count; i++) {
    const upb_MiniTableField* f = upb_MiniTable_GetFieldByIndex(m, i);
    const upb_MiniTable* m2 = upb_MiniTable_SubMessage(m, f);

    switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(f)) {
      case kUpb_FieldMode_Array: {
        upb_Array* arr = upb_Message_GetMutableArray(msg, f);
        if (arr) upb_Array_Freeze(arr, m2);
        break;
      }
      case kUpb_FieldMode_Map: {
        upb_Map* map = upb_Message_GetMutableMap(msg, f);
        if (map) {
          const upb_MiniTableField* f2 = upb_MiniTable_MapValue(m2);
          const upb_MiniTable* m3 = upb_MiniTable_SubMessage(m2, f2);
          upb_Map_Freeze(map, m3);
        }
        break;
      }
      case kUpb_FieldMode_Scalar: {
        if (m2) {
          upb_Message* msg2 = upb_Message_GetMutableMessage(msg, f);
          if (msg2) upb_Message_Freeze(msg2, m2);
        }
        break;
      }
    }
  }

  // Extensions.
  size_t ext_count;
  const upb_Extension* ext = UPB_PRIVATE(_upb_Message_Getexts)(msg, &ext_count);

  for (size_t i = 0; i < ext_count; i++) {
    const upb_MiniTableExtension* e = ext[i].ext;
    const upb_MiniTableField* f = &e->UPB_PRIVATE(field);
    const upb_MiniTable* m2 = upb_MiniTableExtension_GetSubMessage(e);

    upb_MessageValue val;
    memcpy(&val, &ext[i].data, sizeof(upb_MessageValue));

    switch (UPB_PRIVATE(_upb_MiniTableField_Mode)(f)) {
      case kUpb_FieldMode_Array: {
        upb_Array* arr = (upb_Array*)val.array_val;
        if (arr) upb_Array_Freeze(arr, m2);
        break;
      }
      case kUpb_FieldMode_Map:
        UPB_UNREACHABLE();  // Maps cannot be extensions.
        break;
      case kUpb_FieldMode_Scalar:
        if (upb_MiniTableField_IsSubMessage(f)) {
          upb_Message* msg2 = (upb_Message*)val.msg_val;
          if (msg2) upb_Message_Freeze(msg2, m2);
        }
        break;
    }
  }
}